

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprContinue * AnalyzeContinue(ExpressionContext *ctx,SynContinue *syntax)

{
  SynNumber *source;
  TypeBase *pTVar1;
  ScopeData *pSVar2;
  int iVar3;
  ExprBase *pEVar4;
  undefined4 extraout_var;
  char *msg;
  FunctionData *onwerFunction;
  uint depth;
  _func_int **pp_Var6;
  ExprContinue *pEVar5;
  
  if (syntax->number == (SynNumber *)0x0) {
    pp_Var6 = (_func_int **)0x1;
  }
  else {
    pEVar4 = AnalyzeExpression(ctx,&syntax->number->super_SynBase);
    source = syntax->number;
    pEVar4 = CreateCast(ctx,&source->super_SynBase,pEVar4,ctx->typeLong,false);
    pEVar4 = anon_unknown.dwarf_1117a3::EvaluateExpression(ctx,&source->super_SynBase,pEVar4);
    if ((pEVar4 == (ExprBase *)0x0) || (pEVar4->typeID != 6)) {
      syntax = (SynContinue *)syntax->number;
      msg = "ERROR: continue statement must be followed by \';\' or a constant";
      goto LAB_001fda1e;
    }
    pp_Var6 = pEVar4[1]._vptr_ExprBase;
    if ((long)pp_Var6 < 1) {
      syntax = (SynContinue *)syntax->number;
      msg = "ERROR: continue level can\'t be negative or zero";
      goto LAB_001fda1e;
    }
  }
  depth = (uint)pp_Var6;
  if (depth <= ctx->scope->contiueDepth) {
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar5 = (ExprContinue *)CONCAT44(extraout_var,iVar3);
    pTVar1 = ctx->typeVoid;
    for (pSVar2 = ctx->scope; (pSVar2 != (ScopeData *)0x0 && (pSVar2->ownerType == (TypeBase *)0x0))
        ; pSVar2 = pSVar2->scope) {
      onwerFunction = pSVar2->ownerFunction;
      if (onwerFunction != (FunctionData *)0x0) goto LAB_001fd9af;
    }
    onwerFunction = (FunctionData *)0x0;
LAB_001fd9af:
    pEVar4 = CreateContinueUpvalueClose(ctx,&syntax->super_SynBase,onwerFunction,ctx->scope,depth);
    (pEVar5->super_ExprBase).typeID = 0x35;
    (pEVar5->super_ExprBase).source = &syntax->super_SynBase;
    (pEVar5->super_ExprBase).type = pTVar1;
    (pEVar5->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar5->super_ExprBase).listed = false;
    (pEVar5->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e70e8;
    *(uint *)&(pEVar5->super_ExprBase).field_0x2c = depth;
    pEVar5->closures = pEVar4;
    return pEVar5;
  }
  msg = "ERROR: continue level is greater that loop depth";
LAB_001fda1e:
  anon_unknown.dwarf_1117a3::Stop(ctx,&syntax->super_SynBase,msg);
}

Assistant:

ExprContinue* AnalyzeContinue(ExpressionContext &ctx, SynContinue *syntax)
{
	unsigned depth = 1;

	if(syntax->number)
	{
		ExprBase *numberValue = AnalyzeExpression(ctx, syntax->number);

		if(ExprIntegerLiteral *number = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, syntax->number, CreateCast(ctx, syntax->number, numberValue, ctx.typeLong, false))))
		{
			if(number->value <= 0)
				Stop(ctx, syntax->number, "ERROR: continue level can't be negative or zero");

			depth = unsigned(number->value);
		}
		else
		{
			Stop(ctx, syntax->number, "ERROR: continue statement must be followed by ';' or a constant");
		}
	}

	if(ctx.scope->contiueDepth < depth)
		Stop(ctx, syntax, "ERROR: continue level is greater that loop depth");

	return new (ctx.get<ExprContinue>()) ExprContinue(syntax, ctx.typeVoid, depth, CreateContinueUpvalueClose(ctx, syntax, ctx.GetCurrentFunction(ctx.scope), ctx.scope, depth));
}